

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::ShaderCompilerLightCase::init
          (ShaderCompilerLightCase *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  Texture2D *this_00;
  Texture2D *pTVar6;
  TextureFormat *format;
  PixelBufferAccess *access;
  EVP_PKEY_CTX *ctx_00;
  undefined1 local_64 [8];
  TextureFormatInfo fmtInfo;
  Functions *gl;
  ShaderCompilerLightCase *this_local;
  long lVar5;
  
  pRVar4 = gles3::Context::getRenderContext
                     ((this->super_ShaderCompilerCase).super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  this_00 = (Texture2D *)operator_new(0x70);
  pRVar4 = gles3::Context::getRenderContext
                     ((this->super_ShaderCompilerCase).super_TestCase.m_context);
  glu::Texture2D::Texture2D(this_00,pRVar4,0x1907,0x1401,0x40,0x40);
  this->m_texture = this_00;
  pTVar6 = glu::Texture2D::getRefTexture(this->m_texture);
  format = tcu::TextureLevelPyramid::getFormat(&pTVar6->super_TextureLevelPyramid);
  tcu::getTextureFormatInfo((TextureFormatInfo *)local_64,format);
  pTVar6 = glu::Texture2D::getRefTexture(this->m_texture);
  tcu::Texture2D::allocLevel(pTVar6,0);
  pTVar6 = glu::Texture2D::getRefTexture(this->m_texture);
  access = tcu::TextureLevelPyramid::getLevel(&pTVar6->super_TextureLevelPyramid,0);
  tcu::fillWithComponentGradients(access,(Vec4 *)local_64,(Vec4 *)(fmtInfo.valueMin.m_data + 2));
  (**(code **)(lVar5 + 8))(0x84c0);
  pcVar1 = *(code **)(lVar5 + 0xb8);
  dVar3 = glu::Texture2D::getGLTexture(this->m_texture);
  (*pcVar1)(0xde1,dVar3);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,0x2600);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2802,0x812f);
  ctx_00 = (EVP_PKEY_CTX *)0x2803;
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2803,0x812f);
  (*this->m_texture->_vptr_Texture2D[2])();
  iVar2 = ShaderCompilerCase::init(&this->super_ShaderCompilerCase,ctx_00);
  return iVar2;
}

Assistant:

void ShaderCompilerLightCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// Setup texture.

	DE_ASSERT(m_texture == DE_NULL);

	m_texture = new glu::Texture2D(m_context.getRenderContext(), GL_RGB, GL_UNSIGNED_BYTE, TEXTURE_WIDTH, TEXTURE_HEIGHT);

	tcu::TextureFormatInfo fmtInfo = tcu::getTextureFormatInfo(m_texture->getRefTexture().getFormat());

	m_texture->getRefTexture().allocLevel(0);
	tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevel(0), fmtInfo.valueMin, fmtInfo.valueMax);

	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	m_texture->upload();

	ShaderCompilerCase::init();
}